

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable.c
# Opt level: O0

void ares_htable_buckets_destroy(ares_llist_t **buckets,uint size,ares_bool_t destroy_vals)

{
  uint local_1c;
  uint i;
  ares_bool_t destroy_vals_local;
  uint size_local;
  ares_llist_t **buckets_local;
  
  if (buckets != (ares_llist_t **)0x0) {
    for (local_1c = 0; local_1c < size; local_1c = local_1c + 1) {
      if (buckets[local_1c] != (ares_llist_t *)0x0) {
        if (destroy_vals == ARES_FALSE) {
          ares_llist_replace_destructor(buckets[local_1c],(ares_llist_destructor_t)0x0);
        }
        ares_llist_destroy(buckets[local_1c]);
      }
    }
    ares_free(buckets);
  }
  return;
}

Assistant:

static void ares_htable_buckets_destroy(ares_llist_t **buckets,
                                        unsigned int   size,
                                        ares_bool_t    destroy_vals)
{
  unsigned int i;

  if (buckets == NULL) {
    return;
  }

  for (i = 0; i < size; i++) {
    if (buckets[i] == NULL) {
      continue;
    }

    if (!destroy_vals) {
      ares_llist_replace_destructor(buckets[i], NULL);
    }

    ares_llist_destroy(buckets[i]);
  }

  ares_free(buckets);
}